

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O2

int soundfiler_writeascii(t_soundfiler *x,char *filename,t_asciiargs *a)

{
  int iVar1;
  _binbuf *x_00;
  long lVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  char path [1000];
  
  x_00 = binbuf_new();
  canvas_makefilename(x->x_canvas,filename,path,1000);
  if (200000 < a->aa_nframes) {
    post("warning: writing %d table points to ascii file!");
  }
  lVar3 = (long)(int)a->aa_onsetframe;
  for (lVar5 = 0; lVar5 < a->aa_nframes; lVar5 = lVar5 + 1) {
    for (lVar2 = 0; lVar2 < a->aa_nchannels; lVar2 = lVar2 + 1) {
      binbuf_addv(x_00,"f",(double)(a->aa_vectors[lVar2][lVar3].w_float * a->aa_normfactor));
    }
    lVar3 = lVar3 + 1;
  }
  binbuf_addv(x_00,";");
  iVar1 = binbuf_write(x_00,path,"",1);
  binbuf_free(x_00);
  iVar4 = (int)lVar5;
  if (iVar1 != 0) {
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int soundfiler_writeascii(t_soundfiler *x, const char *filename, t_asciiargs *a)
{
    char path[MAXPDSTRING];
    t_binbuf *b = binbuf_new();
    int i, j, frameswritten = 0, ret = 1;
#ifdef DEBUG_SOUNDFILE
    post("ascii write: frames %d onset %d channels %d",
        a->aa_nframes, a->aa_onsetframe, a->aa_nchannels);
#endif
    canvas_makefilename(x->x_canvas, filename, path, MAXPDSTRING);
    if (a->aa_nframes > 200000)
        post("warning: writing %d table points to ascii file!");
    for (i = a->aa_onsetframe; frameswritten < a->aa_nframes; ++i)
    {
        for (j = 0; j < a->aa_nchannels; ++j)
            binbuf_addv(b, "f", a->aa_vectors[j][i].w_float * a->aa_normfactor);
        frameswritten++;
    }
    binbuf_addv(b, ";");
    ret = binbuf_write(b, path, "", 1); /* convert semis to cr */
    binbuf_free(b);
    return (ret == 0 ? frameswritten : 0);
}